

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O2

void consume(void)

{
  rep in_RAX;
  optional<int> oVar1;
  ostream *poVar2;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_38.__r = in_RAX;
  rtb::Concurrency::Queue<int>::subscribe(&q);
  while( true ) {
    oVar1 = rtb::Concurrency::Queue<int>::pop(&q);
    if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Consumer (id#");
    __id._M_thread = pthread_self();
    pbVar3 = std::operator<<(poVar2,__id);
    poVar2 = std::operator<<(pbVar3,"): ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,
                        oVar1.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_38.__r = 0x14;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  }
  rtb::Concurrency::Queue<int>::unsubscribe(&q);
  return;
}

Assistant:

void consume() {
    // Important, you always need to subscribe to the `Queue` prior reading from it
    q.subscribe();
    while (auto val{ q.pop() }) {
        cout << "Consumer (id#" << std::this_thread::get_id() << "): " << val.value() << endl;
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    // When no consumers are subscribet to the `Queue`, data is removed from the Queue and
    // no new data is added until a new consumer subscribes
    q.unsubscribe();
}